

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_controller.cpp
# Opt level: O2

void __thiscall
r_exec::AntiPGMController::AntiPGMController(AntiPGMController *this,View *ipgm_view)

{
  _Object *this_00;
  P<r_exec::Overlay> local_20;
  
  _PGMController::_PGMController(&this->super__PGMController,ipgm_view);
  (this->super__PGMController).super_OController.super_Controller.super__Object._vptr__Object =
       (_func_int **)&PTR__InputLessPGMController_001d2f60;
  (this->super__PGMController).field_0x99 = 0;
  (this->m_hostMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_hostMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_hostMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_hostMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_hostMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this_00 = (_Object *)operator_new(0xe8);
  AntiPGMOverlay::AntiPGMOverlay((AntiPGMOverlay *)this_00,(Controller *)this);
  LOCK();
  (this_00->refCount).super___atomic_base<long>._M_i =
       (this_00->refCount).super___atomic_base<long>._M_i + 1;
  UNLOCK();
  local_20.object = this_00;
  r_code::list<core::P<r_exec::Overlay>_>::push_back
            (&(this->super__PGMController).super_OController.overlays,&local_20);
  core::P<r_exec::Overlay>::~P(&local_20);
  return;
}

Assistant:

AntiPGMController::AntiPGMController(r_code::View *ipgm_view): _PGMController(ipgm_view), successful_match(false)
{
    overlays.push_back(new AntiPGMOverlay(this));
}